

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

bool slang::syntax::PostfixUnaryExpressionSyntax::isKind(SyntaxKind kind)

{
  return kind - PostdecrementExpression < 2;
}

Assistant:

bool PostfixUnaryExpressionSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::PostdecrementExpression:
        case SyntaxKind::PostincrementExpression:
            return true;
        default:
            return false;
    }
}